

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonblocking_notifier.hpp
# Opt level: O0

void __thiscall tf::NonblockingNotifierV2::prepare_wait(NonblockingNotifierV2 *this,Waiter *param_1)

{
  Waiter *param_1_local;
  NonblockingNotifierV2 *this_local;
  
  LOCK();
  (this->_state).super___atomic_base<unsigned_long>._M_i =
       (this->_state).super___atomic_base<unsigned_long>._M_i + 0x4000;
  UNLOCK();
  return;
}

Assistant:

void prepare_wait(Waiter*) {
    _state.fetch_add(kWaiterInc, std::memory_order_relaxed);
    std::atomic_thread_fence(std::memory_order_seq_cst);
  }